

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::image::anon_unknown_2::BinaryAtomicInstanceBase::iterate
          (TestStatus *__return_storage_ptr__,BinaryAtomicInstanceBase *this)

{
  UVec3 *pUVar1;
  MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *this_00;
  VkImage image;
  long lVar2;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkDeviceSize bufferSizeBytes;
  MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *pMVar3;
  void *pvVar4;
  int iVar5;
  deUint32 dVar6;
  VkImageViewType imageViewType;
  VkFormat format;
  deUint32 dVar7;
  VkDevice device;
  DeviceInterface *pDVar8;
  VkQueue queue;
  Allocator *allocator;
  undefined4 extraout_var;
  Image *this_01;
  Buffer *this_02;
  ProgramBinary *binary;
  deUint32 z;
  uint z_00;
  TestStatus *pTVar9;
  ulong bufferSize;
  deUint32 arraySize;
  deUint32 x;
  uint x_00;
  deUint32 y;
  uint y_00;
  VkExtent3D extent;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 uVar10;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 uVar12;
  allocator<char> local_3c1;
  DeviceInterface *local_3c0;
  TextureFormat *local_3b8;
  UVec3 gridSize;
  RefBase<vk::VkCommandBuffer_s_*> local_388;
  Allocation *local_368;
  UVec3 *local_360;
  VkDeviceSize local_358;
  deUint32 local_350;
  uint local_34c;
  TestStatus *local_348;
  MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *local_340;
  VkImageMemoryBarrier resultImagePreCopyBarrier;
  string local_2e8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  deUint32 local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  deUint32 local_298;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_288;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_268;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_248;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_228;
  undefined8 local_208;
  undefined8 uStack_200;
  deUint32 local_1f8;
  VkImageMemoryBarrier resultImagePostCopyBarrier;
  Buffer inputBuffer;
  IVec4 initialValue;
  PixelBufferAccess inputPixelBuffer;
  VkBufferMemoryBarrier outputBufferPreHostReadBarrier;
  VkBufferImageCopy bufferImageCopyParams;
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  VkImageCreateInfo local_88;
  
  local_348 = __return_storage_ptr__;
  device = Context::getDevice((this->super_TestInstance).m_context);
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_350 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  iVar5 = tcu::getPixelSize(this->m_format);
  local_368 = (Allocation *)CONCAT44(local_368._4_4_,iVar5);
  pUVar1 = &this->m_imageSize;
  dVar6 = getNumPixels(this->m_imageType,pUVar1);
  local_358 = CONCAT44(extraout_var,dVar6);
  local_34c = (*(this->super_TestInstance)._vptr_TestInstance[3])(this);
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.flags = (uint)(this->m_imageType - IMAGE_TYPE_CUBE < 2) << 4;
  local_88.imageType = mapImageType(this->m_imageType);
  local_3b8 = &this->m_format;
  local_88.format = ::vk::mapTextureFormat(&this->m_format);
  getLayerSize(this->m_imageType,pUVar1);
  local_88.extent.width = resultImagePreCopyBarrier.sType;
  local_88.extent.height = resultImagePreCopyBarrier._4_4_;
  local_88.extent.depth = (deUint32)resultImagePreCopyBarrier.pNext;
  local_88.mipLevels = 1;
  local_88.arrayLayers = getNumLayers(this->m_imageType,pUVar1);
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_88.usage = 0xb;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 0;
  local_88.pQueueFamilyIndices = (deUint32 *)0x0;
  local_88.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this_01 = (Image *)operator_new(0x30);
  local_3c0 = pDVar8;
  Image::Image(this_01,pDVar8,device,allocator,&local_88,(MemoryRequirement)0x0);
  resultImagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePreCopyBarrier._4_4_ = 0;
  local_340 = &this->m_resultImage;
  data._8_4_ = in_stack_fffffffffffffc10;
  data.ptr = (Image *)in_stack_fffffffffffffc08;
  data._12_4_ = in_stack_fffffffffffffc14;
  de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::assignData
            (&local_340->super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
             ,data);
  de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~UniqueBase
            ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
             &resultImagePreCopyBarrier);
  local_360 = pUVar1;
  dVar6 = getNumLayers(this->m_imageType,pUVar1);
  image.m_internal =
       (((this->m_resultImage).
         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)->
       m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  imageViewType = mapImageViewType(this->m_imageType);
  format = ::vk::mapTextureFormat(local_3b8);
  pDVar8 = local_3c0;
  local_208 = 1;
  uStack_200 = 1;
  uVar10 = 1;
  uVar11 = 1;
  uVar12 = 0;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = dVar6;
  local_1f8 = dVar6;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&resultImagePostCopyBarrier,local_3c0,
                device,image,imageViewType,format,subresourceRange);
  resultImagePreCopyBarrier.srcAccessMask = resultImagePostCopyBarrier.srcAccessMask;
  resultImagePreCopyBarrier.dstAccessMask = resultImagePostCopyBarrier.dstAccessMask;
  resultImagePreCopyBarrier.oldLayout = resultImagePostCopyBarrier.oldLayout;
  resultImagePreCopyBarrier.newLayout = resultImagePostCopyBarrier.newLayout;
  resultImagePreCopyBarrier.sType = resultImagePostCopyBarrier.sType;
  resultImagePreCopyBarrier._4_4_ = resultImagePostCopyBarrier._4_4_;
  resultImagePreCopyBarrier.pNext = resultImagePostCopyBarrier.pNext;
  resultImagePostCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePostCopyBarrier._4_4_ = 0;
  resultImagePostCopyBarrier.pNext = (void *)0x0;
  resultImagePostCopyBarrier.srcAccessMask = 0;
  resultImagePostCopyBarrier.dstAccessMask = 0;
  resultImagePostCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  resultImagePostCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&(this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  bufferSize = (ulong)(uint)((int)local_358 * (int)local_368);
  (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)resultImagePreCopyBarrier._16_8_;
  (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
       = resultImagePreCopyBarrier._0_8_;
  (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&resultImagePostCopyBarrier);
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultImagePreCopyBarrier,bufferSize,1);
  image::Buffer::Buffer
            (&inputBuffer,pDVar8,device,allocator,(VkBufferCreateInfo *)&resultImagePreCopyBarrier,
             (MemoryRequirement)0x1);
  pUVar1 = local_360;
  if ((ulong)this->m_operation < 7) {
    iVar5 = *(int *)(&DAT_009d43e8 + (ulong)this->m_operation * 4);
  }
  else {
    iVar5 = -1;
  }
  tcu::Vector<int,_4>::Vector(&initialValue,iVar5);
  getShaderGridSize((image *)&gridSize,this->m_imageType,pUVar1);
  local_368 = inputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&inputPixelBuffer,local_3b8,gridSize.m_data[0],gridSize.m_data[1],gridSize.m_data[2],
             (inputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  local_3b8 = (TextureFormat *)(ulong)local_34c;
  local_358 = bufferSize;
  for (z_00 = 0; bufferSizeBytes = local_358, z_00 < gridSize.m_data[2]; z_00 = z_00 + 1) {
    for (y_00 = 0; y_00 < gridSize.m_data[1]; y_00 = y_00 + 1) {
      for (x_00 = 0; x_00 < gridSize.m_data[0]; x_00 = x_00 + 1) {
        tcu::PixelBufferAccess::setPixel(&inputPixelBuffer,&initialValue,x_00,y_00,z_00);
      }
    }
  }
  ::vk::flushMappedMemoryRange
            (local_3c0,device,(VkDeviceMemory)(local_368->m_memory).m_internal,local_368->m_offset,
             local_358);
  pUVar1 = local_360;
  this_02 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultImagePreCopyBarrier,(VkDeviceSize)local_3b8,2);
  image::Buffer::Buffer
            (this_02,local_3c0,device,allocator,(VkBufferCreateInfo *)&resultImagePreCopyBarrier,
             (MemoryRequirement)0x1);
  resultImagePostCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePostCopyBarrier._4_4_ = 0;
  this_00 = &this->m_outputBuffer;
  data_00._8_4_ = uVar11;
  data_00.ptr = (Buffer *)uVar10;
  data_00._12_4_ = uVar12;
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::assignData
            (&this_00->super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
             ,data_00);
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~UniqueBase
            ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
             &resultImagePostCopyBarrier);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (((this->super_TestInstance).m_context)->m_progCollection,&this->m_name);
  pDVar8 = local_3c0;
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImagePreCopyBarrier,local_3c0,device,
             binary,0);
  local_228.m_data.deleter.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  local_228.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_228.m_data.object.m_internal = resultImagePreCopyBarrier._0_8_;
  local_228.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  resultImagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePreCopyBarrier._4_4_ = 0;
  resultImagePreCopyBarrier.pNext = (void *)0x0;
  resultImagePreCopyBarrier.srcAccessMask = 0;
  resultImagePreCopyBarrier.dstAccessMask = 0;
  resultImagePreCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  resultImagePreCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&resultImagePreCopyBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultImagePreCopyBarrier,pDVar8,
                     device,(VkDescriptorSetLayout)
                            (this->m_descriptorSetLayout).
                            super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal)
  ;
  local_288.m_data.deleter.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  local_288.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_288.m_data.object.m_internal = resultImagePreCopyBarrier._0_8_;
  local_288.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  resultImagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePreCopyBarrier._4_4_ = 0;
  resultImagePreCopyBarrier.pNext = (void *)0x0;
  resultImagePreCopyBarrier.srcAccessMask = 0;
  resultImagePreCopyBarrier.dstAccessMask = 0;
  resultImagePreCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  resultImagePreCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&resultImagePreCopyBarrier);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&resultImagePreCopyBarrier,pDVar8,
                      device,(VkPipelineLayout)local_288.m_data.object.m_internal,
                      (VkShaderModule)local_228.m_data.object.m_internal);
  local_248.m_data.deleter.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  local_248.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_248.m_data.object.m_internal = resultImagePreCopyBarrier._0_8_;
  local_248.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  resultImagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePreCopyBarrier._4_4_ = 0;
  resultImagePreCopyBarrier.pNext = (void *)0x0;
  resultImagePreCopyBarrier.srcAccessMask = 0;
  resultImagePreCopyBarrier.dstAccessMask = 0;
  resultImagePreCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  resultImagePreCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&resultImagePreCopyBarrier);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&resultImagePreCopyBarrier,pDVar8,device,2,
             local_350,(VkAllocationCallbacks *)0x0);
  local_268.m_data.deleter.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  local_268.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_268.m_data.object.m_internal = resultImagePreCopyBarrier._0_8_;
  local_268.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  resultImagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePreCopyBarrier._4_4_ = 0;
  resultImagePreCopyBarrier.pNext = (void *)0x0;
  resultImagePreCopyBarrier.srcAccessMask = 0;
  resultImagePreCopyBarrier.dstAccessMask = 0;
  resultImagePreCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  resultImagePreCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&resultImagePreCopyBarrier);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&resultImagePreCopyBarrier,pDVar8,device,
             (VkCommandPool)local_268.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_388.m_data.deleter.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  local_388.m_data.deleter.m_pool.m_internal._0_4_ = resultImagePreCopyBarrier.oldLayout;
  local_388.m_data.deleter.m_pool.m_internal._4_4_ = resultImagePreCopyBarrier.newLayout;
  local_388.m_data.object = (VkCommandBuffer_s *)resultImagePreCopyBarrier._0_8_;
  local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  resultImagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePreCopyBarrier._4_4_ = 0;
  resultImagePreCopyBarrier.pNext = (void *)0x0;
  resultImagePreCopyBarrier.srcAccessMask = 0;
  resultImagePreCopyBarrier.dstAccessMask = 0;
  resultImagePreCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  resultImagePreCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&resultImagePreCopyBarrier);
  beginCommandBuffer(pDVar8,local_388.m_data.object);
  (*pDVar8->_vptr_DeviceInterface[0x4c])
            (pDVar8,local_388.m_data.object,1,local_248.m_data.object.m_internal);
  (*pDVar8->_vptr_DeviceInterface[0x56])
            (pDVar8,local_388.m_data.object,1,local_288.m_data.object.m_internal,0,1,
             &this->m_descriptorSet,0,0);
  makeBufferMemoryBarrier
            (&inputBufferPostHostWriteBarrier,0x4000,0x800,
             (VkBuffer)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSizeBytes);
  local_2a8 = 1;
  uStack_2a0 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = dVar6;
  local_298 = dVar6;
  makeImageMemoryBarrier
            (&resultImagePreCopyBarrier,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             (VkImage)(((local_340->
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange_00);
  arraySize = 0;
  (*local_3c0->_vptr_DeviceInterface[0x6d])
            (local_3c0,local_388.m_data.object,1,0x1000,0,0,0,1,
             (int)&inputBufferPostHostWriteBarrier,1,&resultImagePreCopyBarrier);
  getLayerSize(this->m_imageType,pUVar1);
  pvVar4 = resultImagePostCopyBarrier.pNext;
  uVar10 = resultImagePostCopyBarrier._0_8_;
  dVar7 = getNumLayers(this->m_imageType,pUVar1);
  extent._0_8_ = (ulong)pvVar4 & 0xffffffff;
  extent.depth = dVar7;
  makeBufferImageCopy(&bufferImageCopyParams,(image *)uVar10,extent,arraySize);
  pMVar3 = local_340;
  (*local_3c0->_vptr_DeviceInterface[0x62])
            (local_3c0,local_388.m_data.object,
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,
             (((local_340->
               super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>).m_data.
              ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
             7,1,&bufferImageCopyParams);
  local_2c8 = 1;
  uStack_2c0 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = dVar6;
  local_2b8 = dVar6;
  makeImageMemoryBarrier
            (&resultImagePostCopyBarrier,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)(((pMVar3->
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange_01);
  (*local_3c0->_vptr_DeviceInterface[0x6d])
            (local_3c0,local_388.m_data.object,0x1000,0x800,0,0,0,0,0,1,&resultImagePostCopyBarrier)
  ;
  (*(this->super_TestInstance)._vptr_TestInstance[6])(this,local_388.m_data.object);
  (*local_3c0->_vptr_DeviceInterface[0x5d])
            (local_3c0,local_388.m_data.object,(ulong)(gridSize.m_data[0] * 5),
             (ulong)gridSize.m_data[1]);
  (*(this->super_TestInstance)._vptr_TestInstance[7])(this,local_388.m_data.object);
  makeBufferMemoryBarrier
            (&outputBufferPreHostReadBarrier,0x1000,0x2000,
             (VkBuffer)
             (((this_00->
               super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).m_data
              .ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,(VkDeviceSize)local_3b8);
  pDVar8 = local_3c0;
  (*local_3c0->_vptr_DeviceInterface[0x6d])
            (local_3c0,local_388.m_data.object,0x1000,0x4000,0,0,0,1,
             (int)&outputBufferPreHostReadBarrier,0,0);
  endCommandBuffer(pDVar8,local_388.m_data.object);
  submitCommandsAndWait(pDVar8,device,queue,local_388.m_data.object);
  lVar2 = (long)(((this_00->
                  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).
                  m_data.ptr)->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (pDVar8,device,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),*(VkDeviceSize *)(lVar2 + 0x10),
             (VkDeviceSize)local_3b8);
  iVar5 = (*(this->super_TestInstance)._vptr_TestInstance[8])(this,lVar2);
  if ((char)iVar5 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"Comparison failed",&local_3c1);
    pTVar9 = local_348;
    tcu::TestStatus::fail(local_348,&local_2e8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"Comparison succeeded",&local_3c1);
    pTVar9 = local_348;
    tcu::TestStatus::pass(local_348,&local_2e8);
  }
  std::__cxx11::string::~string((string *)&local_2e8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_388);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_268);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_248);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_288);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_228);
  image::Buffer::~Buffer(&inputBuffer);
  return pTVar9;
}

Assistant:

tcu::TestStatus	BinaryAtomicInstanceBase::iterate (void)
{
	const VkDevice			device				= m_context.getDevice();
	const DeviceInterface&	deviceInterface		= m_context.getDeviceInterface();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();
	const VkDeviceSize		imageSizeInBytes	= tcu::getPixelSize(m_format) * getNumPixels(m_imageType, m_imageSize);
	const VkDeviceSize		outBuffSizeInBytes	= getOutputBufferSize();

	const VkImageCreateInfo imageParams	=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,					// VkStructureType			sType;
		DE_NULL,												// const void*				pNext;
		(m_imageType == IMAGE_TYPE_CUBE ||
		 m_imageType == IMAGE_TYPE_CUBE_ARRAY ?
		 (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT :
		 (VkImageCreateFlags)0u),								// VkImageCreateFlags		flags;
		mapImageType(m_imageType),								// VkImageType				imageType;
		mapTextureFormat(m_format),								// VkFormat					format;
		makeExtent3D(getLayerSize(m_imageType, m_imageSize)),	// VkExtent3D				extent;
		1u,														// deUint32					mipLevels;
		getNumLayers(m_imageType, m_imageSize),					// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,									// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,								// VkImageTiling			tiling;
		VK_IMAGE_USAGE_STORAGE_BIT |
		VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
		VK_IMAGE_USAGE_TRANSFER_DST_BIT,						// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,								// VkSharingMode			sharingMode;
		0u,														// deUint32					queueFamilyIndexCount;
		DE_NULL,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,								// VkImageLayout			initialLayout;
	};

	//Create the image that is going to store results of atomic operations
	m_resultImage = de::MovePtr<Image>(new Image(deviceInterface, device, allocator, imageParams, MemoryRequirement::Any));

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	m_resultImageView = makeImageView(deviceInterface, device, m_resultImage->get(), mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange);

	//Prepare the buffer with the initial data for the image
	const Buffer inputBuffer(deviceInterface, device, allocator, makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT), MemoryRequirement::HostVisible);

	Allocation& inputBufferAllocation = inputBuffer.getAllocation();

	//Prepare the initial data for the image
	const tcu::IVec4 initialValue(getOperationInitialValue(m_operation));

	tcu::UVec3 gridSize = getShaderGridSize(m_imageType, m_imageSize);
	tcu::PixelBufferAccess inputPixelBuffer(m_format, gridSize.x(), gridSize.y(), gridSize.z(), inputBufferAllocation.getHostPtr());

	for (deUint32 z = 0; z < gridSize.z(); z++)
	for (deUint32 y = 0; y < gridSize.y(); y++)
	for (deUint32 x = 0; x < gridSize.x(); x++)
	{
		inputPixelBuffer.setPixel(initialValue, x, y, z);
	}

	flushMappedMemoryRange(deviceInterface, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), imageSizeInBytes);

	// Create a buffer to store shader output copied from result image
	m_outputBuffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, makeBufferCreateInfo(outBuffSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible));

	prepareResources();

	prepareDescriptors();

	// Create pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, device, m_context.getBinaryCollection().get(m_name), 0));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, device, *m_descriptorSetLayout));
	const Unique<VkPipeline>		pipeline(makeComputePipeline(deviceInterface, device, *pipelineLayout, *shaderModule));

	// Create command buffer
	const Unique<VkCommandPool>		cmdPool(createCommandPool(deviceInterface, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer(allocateCommandBuffer(deviceInterface, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(deviceInterface, *cmdBuffer);

	deviceInterface.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	deviceInterface.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);

	const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier	=
		makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT,
								VK_ACCESS_TRANSFER_READ_BIT,
								*inputBuffer,
								0ull,
								imageSizeInBytes);

	const VkImageMemoryBarrier	resultImagePreCopyBarrier =
		makeImageMemoryBarrier(	0u,
								VK_ACCESS_TRANSFER_WRITE_BIT,
								VK_IMAGE_LAYOUT_UNDEFINED,
								VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
								m_resultImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, DE_FALSE, 0u, DE_NULL, 1u, &inputBufferPostHostWriteBarrier, 1u, &resultImagePreCopyBarrier);

	const VkBufferImageCopy		bufferImageCopyParams = makeBufferImageCopy(makeExtent3D(getLayerSize(m_imageType, m_imageSize)), getNumLayers(m_imageType, m_imageSize));

	deviceInterface.cmdCopyBufferToImage(*cmdBuffer, *inputBuffer, m_resultImage->get(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &bufferImageCopyParams);

	const VkImageMemoryBarrier	resultImagePostCopyBarrier	=
		makeImageMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
								VK_ACCESS_SHADER_READ_BIT,
								VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
								VK_IMAGE_LAYOUT_GENERAL,
								m_resultImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, DE_FALSE, 0u, DE_NULL, 0u, DE_NULL, 1u, &resultImagePostCopyBarrier);

	commandsBeforeCompute(*cmdBuffer);

	deviceInterface.cmdDispatch(*cmdBuffer, NUM_INVOCATIONS_PER_PIXEL*gridSize.x(), gridSize.y(), gridSize.z());

	commandsAfterCompute(*cmdBuffer);

	const VkBufferMemoryBarrier	outputBufferPreHostReadBarrier
		= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
									VK_ACCESS_HOST_READ_BIT,
									m_outputBuffer->get(),
									0ull,
									outBuffSizeInBytes);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, DE_FALSE, 0u, DE_NULL, 1u, &outputBufferPreHostReadBarrier, 0u, DE_NULL);

	endCommandBuffer(deviceInterface, *cmdBuffer);

	submitCommandsAndWait(deviceInterface, device, queue, *cmdBuffer);

	Allocation& outputBufferAllocation = m_outputBuffer->getAllocation();

	invalidateMappedMemoryRange(deviceInterface, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outBuffSizeInBytes);

	if (verifyResult(outputBufferAllocation))
		return tcu::TestStatus::pass("Comparison succeeded");
	else
		return tcu::TestStatus::fail("Comparison failed");
}